

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void * parallel_iterator_thread(void *args)

{
  int iVar1;
  fdb_status fVar2;
  fdb_status fVar3;
  long in_RDI;
  int i;
  char key [16];
  fdb_doc *doc;
  int num_read;
  fdb_seqnum_t snap_seqnum;
  fdb_status status;
  fdb_iterator *fit2;
  fdb_iterator *fit;
  fdb_kvs_config kvs_config;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  piterator_ctx *ctx;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_config *in_stack_00000128;
  char *in_stack_00000130;
  fdb_file_handle **in_stack_00000138;
  fdb_seqnum_t in_stack_000001b0;
  fdb_kvs_handle **in_stack_000001b8;
  fdb_kvs_handle *in_stack_000001c0;
  undefined2 in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff0a;
  undefined4 in_stack_ffffffffffffff0c;
  fdb_file_handle *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  fdb_status in_stack_ffffffffffffff1c;
  uint local_dc;
  char local_d8 [24];
  size_t *local_c0;
  int local_b4;
  long local_b0;
  fdb_status local_a4;
  fdb_iterator *local_a0;
  fdb_iterator *local_98 [3];
  fdb_doc **in_stack_ffffffffffffff80;
  fdb_kvs_handle *in_stack_ffffffffffffff88;
  timeval local_18;
  long local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  fdb_get_default_kvs_config();
  local_b4 = 0;
  do {
    do {
      if (*(int *)(local_8 + 8) <= local_b4) {
        pthread_exit((void *)0x0);
      }
      local_a4 = fdb_open(in_stack_00000138,in_stack_00000130,in_stack_00000128);
      if (local_a4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe3d);
        parallel_iterator_thread::__test_pass = 0;
        if (local_a4 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe3d,"void *parallel_iterator_thread(void *)");
        }
      }
      local_a4 = fdb_kvs_open_default
                           (in_stack_ffffffffffffff10,
                            (fdb_kvs_handle **)
                            CONCAT44(in_stack_ffffffffffffff0c,
                                     CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08)),
                            (fdb_kvs_config *)0x119b48);
      if (local_a4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe3f);
        parallel_iterator_thread::__test_pass = 0;
        if (local_a4 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe3f,"void *parallel_iterator_thread(void *)");
        }
      }
      std::mutex::lock((mutex *)in_stack_ffffffffffffff10);
      local_a4 = fdb_snapshot_open(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
      if (local_a4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe44);
        parallel_iterator_thread::__test_pass = 0;
        if (local_a4 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe44,"void *parallel_iterator_thread(void *)");
        }
      }
      std::mutex::unlock((mutex *)0x119c4c);
      fdb_get_kvs_seqnum((fdb_kvs_handle *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         (fdb_seqnum_t *)in_stack_ffffffffffffff10);
      in_stack_ffffffffffffff08 = 0;
      in_stack_ffffffffffffff0a = 0;
      local_a4 = fdb_iterator_init(in_stack_ffffffffffffff88,local_98,(void *)0x0,0,(void *)0x0,0,0)
      ;
      fdb_iterator_sequence_init(in_stack_ffffffffffffff88,&local_a0,0,0,0);
    } while (local_a4 == FDB_RESULT_ITERATOR_FAIL);
    local_dc = 0;
    while (local_a4 == FDB_RESULT_SUCCESS) {
      local_c0 = (size_t *)0x0;
      local_a4 = fdb_iterator_get((fdb_iterator *)in_stack_ffffffffffffff88,
                                  in_stack_ffffffffffffff80);
      if (local_a4 != FDB_RESULT_SUCCESS) break;
      sprintf(local_d8,"key%05d",(ulong)local_dc);
      iVar1 = memcmp((void *)local_c0[4],local_d8,*local_c0);
      if (iVar1 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_d8,local_c0[4],
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe57);
        parallel_iterator_thread::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe57,"void *parallel_iterator_thread(void *)");
      }
      if (local_c0[5] != (long)(int)local_dc + 1U) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe58);
        parallel_iterator_thread::__test_pass = 0;
        if (local_c0[5] != (long)(int)local_dc + 1U) {
          __assert_fail("doc->seqnum == (fdb_seqnum_t)i+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe58,"void *parallel_iterator_thread(void *)");
        }
      }
      fdb_doc_free((fdb_doc *)0x119e0a);
      local_c0 = (size_t *)0x0;
      local_a4 = fdb_iterator_get((fdb_iterator *)in_stack_ffffffffffffff88,
                                  in_stack_ffffffffffffff80);
      if (local_a4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe5e);
        parallel_iterator_thread::__test_pass = 0;
        if (local_a4 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe5e,"void *parallel_iterator_thread(void *)");
        }
      }
      iVar1 = memcmp((void *)local_c0[4],local_d8,*local_c0);
      if (iVar1 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_d8,local_c0[4],
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe5f);
        parallel_iterator_thread::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe5f,"void *parallel_iterator_thread(void *)");
      }
      if (local_c0[5] != (long)(int)local_dc + 1U) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe60);
        parallel_iterator_thread::__test_pass = 0;
        if (local_c0[5] != (long)(int)local_dc + 1U) {
          __assert_fail("doc->seqnum == (fdb_seqnum_t)i+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe60,"void *parallel_iterator_thread(void *)");
        }
      }
      fdb_doc_free((fdb_doc *)0x119f8a);
      local_dc = local_dc + 1;
      fVar2 = fdb_iterator_next((fdb_iterator *)
                                CONCAT44(in_stack_ffffffffffffff0c,
                                         CONCAT22(in_stack_ffffffffffffff0a,
                                                  in_stack_ffffffffffffff08)));
      local_a4 = fVar2;
      fVar3 = fdb_iterator_next((fdb_iterator *)
                                CONCAT44(in_stack_ffffffffffffff0c,
                                         CONCAT22(in_stack_ffffffffffffff0a,
                                                  in_stack_ffffffffffffff08)));
      if (fVar2 != fVar3) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe65);
        parallel_iterator_thread::__test_pass = 0;
        in_stack_ffffffffffffff1c = local_a4;
        fVar2 = fdb_iterator_next((fdb_iterator *)
                                  CONCAT44(in_stack_ffffffffffffff0c,
                                           CONCAT22(in_stack_ffffffffffffff0a,
                                                    in_stack_ffffffffffffff08)));
        if (in_stack_ffffffffffffff1c != fVar2) {
          __assert_fail("status == fdb_iterator_next(fit2)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe65,"void *parallel_iterator_thread(void *)");
        }
      }
    }
    if ((int)local_dc != local_b0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe67);
      parallel_iterator_thread::__test_pass = 0;
      if ((int)local_dc != local_b0) {
        __assert_fail("(fdb_seqnum_t)i == snap_seqnum",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe67,"void *parallel_iterator_thread(void *)");
      }
    }
    local_b4 = (int)local_b0;
    local_a4 = fdb_iterator_close((fdb_iterator *)
                                  CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (local_a4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe6b);
      parallel_iterator_thread::__test_pass = 0;
      if (local_a4 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe6b,"void *parallel_iterator_thread(void *)");
      }
    }
    local_a4 = fdb_iterator_close((fdb_iterator *)
                                  CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (local_a4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe6d);
      parallel_iterator_thread::__test_pass = 0;
      if (local_a4 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe6d,"void *parallel_iterator_thread(void *)");
      }
    }
    local_a4 = fdb_kvs_close((fdb_kvs_handle *)
                             CONCAT44(in_stack_ffffffffffffff0c,
                                      CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08))
                            );
    if (local_a4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe6f);
      parallel_iterator_thread::__test_pass = 0;
      if (local_a4 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe6f,"void *parallel_iterator_thread(void *)");
      }
    }
    local_a4 = fdb_kvs_close((fdb_kvs_handle *)
                             CONCAT44(in_stack_ffffffffffffff0c,
                                      CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08))
                            );
    if (local_a4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe71);
      parallel_iterator_thread::__test_pass = 0;
      if (local_a4 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe71,"void *parallel_iterator_thread(void *)");
      }
    }
    local_a4 = fdb_close((fdb_file_handle *)
                         CONCAT44(in_stack_ffffffffffffff0c,
                                  CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08)));
    if (local_a4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe73);
      parallel_iterator_thread::__test_pass = 0;
      if (local_a4 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe73,"void *parallel_iterator_thread(void *)");
      }
    }
  } while( true );
}

Assistant:

void *parallel_iterator_thread(void *args)
{
    TEST_INIT();

    struct piterator_ctx *ctx = (struct piterator_ctx *)args;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_iterator *fit, *fit2;
    fdb_status status;
    fdb_seqnum_t snap_seqnum;
    int num_read = 0;
    fdb_doc *doc;
    char key[16];

    while (num_read < ctx->num_docs) {
        status = fdb_open(&dbfile, ctx->filename, ctx->config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        ctx->lock.lock();
        // Open in-memory snapshot
        status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        ctx->lock.unlock();

        fdb_get_kvs_seqnum(snap_db, &snap_seqnum);
        // Iterate the in-memory snapshot
        status = fdb_iterator_init(snap_db, &fit, 0, 0, 0, 0, FDB_ITR_NONE);
        fdb_iterator_sequence_init(snap_db, &fit2, 0, 0, FDB_ITR_NONE);

        if (status == FDB_RESULT_ITERATOR_FAIL) {
            continue;
        }
        int i = 0;
        while (status == FDB_RESULT_SUCCESS) {
            doc = NULL;
            status = fdb_iterator_get(fit, &doc);
            if (status != FDB_RESULT_SUCCESS) {
                break;
            }
            sprintf(key, "key%05d", i);
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CHK(doc->seqnum == (fdb_seqnum_t)i+1);
            // printf("Got %s seqnum %llu\n", key, doc->seqnum);
            fdb_doc_free(doc);
            doc = NULL;

            status = fdb_iterator_get(fit2, &doc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CHK(doc->seqnum == (fdb_seqnum_t)i+1);
            fdb_doc_free(doc);

            i++;
            status = fdb_iterator_next(fit);
            TEST_CHK(status == fdb_iterator_next(fit2));
        }
        TEST_CHK((fdb_seqnum_t)i == snap_seqnum);
        num_read = snap_seqnum;

        status = fdb_iterator_close(fit);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_iterator_close(fit2);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_close(snap_db);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_close(db);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // shutdown
    thread_exit(0);
    return NULL;
}